

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDExtract
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDExtract *curr
          )

{
  Literal *pLVar1;
  undefined1 local_158 [8];
  Flow flow;
  Literal local_f8;
  Literal local_e0;
  Literal local_c8;
  Literal local_b0;
  Literal local_98;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  undefined1 local_38 [8];
  Literal vec;
  
  visit((Flow *)local_158,this,*(Expression **)(curr + 0x18));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_158);
    wasm::Literal::Literal((Literal *)local_38,pLVar1);
    switch(*(undefined4 *)(curr + 0x10)) {
    case 0:
      pLVar1 = (Literal *)&flow.breakTo.super_IString.str._M_str;
      wasm::Literal::extractLaneSI8x16((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 1:
      pLVar1 = &local_f8;
      wasm::Literal::extractLaneUI8x16((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 2:
      pLVar1 = &local_e0;
      wasm::Literal::extractLaneSI16x8((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 3:
      pLVar1 = &local_c8;
      wasm::Literal::extractLaneUI16x8((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 4:
      pLVar1 = &local_b0;
      wasm::Literal::extractLaneI32x4((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 5:
      pLVar1 = &local_98;
      wasm::Literal::extractLaneI64x2((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 6:
      pLVar1 = &local_80;
      wasm::Literal::extractLaneF16x8((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 7:
      pLVar1 = &local_68;
      wasm::Literal::extractLaneF32x4((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    case 8:
      pLVar1 = &local_50;
      wasm::Literal::extractLaneF64x2((uchar)pLVar1);
      Flow::Flow(__return_storage_ptr__,pLVar1);
      break;
    default:
      wasm::handle_unreachable
                ("invalid op",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x4b8);
    }
    wasm::Literal::~Literal(pLVar1);
    wasm::Literal::~Literal((Literal *)local_38);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDExtract(SIMDExtract* curr) {
    NOTE_ENTER("SIMDExtract");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case ExtractLaneSVecI8x16:
        return vec.extractLaneSI8x16(curr->index);
      case ExtractLaneUVecI8x16:
        return vec.extractLaneUI8x16(curr->index);
      case ExtractLaneSVecI16x8:
        return vec.extractLaneSI16x8(curr->index);
      case ExtractLaneUVecI16x8:
        return vec.extractLaneUI16x8(curr->index);
      case ExtractLaneVecI32x4:
        return vec.extractLaneI32x4(curr->index);
      case ExtractLaneVecI64x2:
        return vec.extractLaneI64x2(curr->index);
      case ExtractLaneVecF16x8:
        return vec.extractLaneF16x8(curr->index);
      case ExtractLaneVecF32x4:
        return vec.extractLaneF32x4(curr->index);
      case ExtractLaneVecF64x2:
        return vec.extractLaneF64x2(curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }